

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

bool __thiscall
Shell::Options::OptionValue<bool>::checkProblemConstraints(OptionValue<bool> *this,Property *prop)

{
  bool bVar1;
  int iVar2;
  Mode MVar3;
  BadOption BVar4;
  pointer pOVar5;
  ostream *poVar6;
  UserErrorException *this_00;
  RefIterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  _Alloc_hider in_stack_ffffffffffffff60;
  RefIterator local_80;
  undefined1 local_70 [32];
  string local_50;
  
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  ::RefIterator::RefIterator(&local_80,&this->_prob_constraints);
  bVar1 = Lib::
          Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
          ::RefIterator::hasNext(&local_80);
  if (bVar1) {
    do {
      Lib::
      Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
      ::RefIterator::next(&local_80);
      if ((this->super_AbstractOptionValue).is_set == true) {
        pOVar5 = std::
                 unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                 ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                               *)0x750e33);
        iVar2 = (**pOVar5->_vptr_OptionProblemConstraint)(pOVar5,prop);
        if ((char)iVar2 == '\0') {
          MVar3 = mode(Lib::env);
          if (MVar3 != SPIDER) {
            BVar4 = getBadOptionChoice(Lib::env);
            if (BVar4 != OFF) {
              poVar6 = std::operator<<((ostream *)&std::cout,"% WARNING: ");
              poVar6 = std::operator<<(poVar6,(string *)&(this->super_AbstractOptionValue).longName)
              ;
              pOVar5 = std::
                       unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                       ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                                     *)0x750ea5);
              (*pOVar5->_vptr_OptionProblemConstraint[1])((string *)&stack0xffffffffffffff60,pOVar5)
              ;
              poVar6 = std::operator<<(poVar6,(string *)&stack0xffffffffffffff60);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
            }
            return false;
          }
          reportSpiderFail();
          this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff60,"% WARNING: ",
                         &(this->super_AbstractOptionValue).longName);
          pOVar5 = std::
                   unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                   ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                                 *)0x750f1f);
          (*pOVar5->_vptr_OptionProblemConstraint[1])(local_70,pOVar5);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff60._M_p,in_stack_ffffffffffffff58);
          Lib::UserErrorException::Exception(this_00,&local_50);
          __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
      }
      bVar1 = Lib::
              Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
              ::RefIterator::hasNext(&local_80);
    } while (bVar1);
  }
  return true;
}

Assistant:

bool Options::OptionValue<T>::checkProblemConstraints(Property* prop){
    Lib::Stack<OptionProblemConstraintUP>::RefIterator it(_prob_constraints);
    while(it.hasNext()){
      OptionProblemConstraintUP& con = it.next();
      // Constraint should hold whenever the option is set
      if(is_set && !con->check(prop)){

         if (env.options->mode() == Mode::SPIDER){
           reportSpiderFail();
           USER_ERROR("% WARNING: " + longName + con->msg());
         }

         switch(env.options->getBadOptionChoice()){
         case BadOption::OFF: break;
         default:
           cout << "% WARNING: " << longName << con->msg() << endl;
         }
         return false;
      }
    }
    return true;
}